

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinLaplace_picard_bnd.c
# Opt level: O0

void PrintFinalStats(void *kmem)

{
  undefined4 uVar1;
  undefined8 in_RDI;
  int retval;
  long leniwB;
  long lenrwB;
  long nfeD;
  long nje;
  long nfe;
  long nni;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  uVar1 = KINGetNumNonlinSolvIters(in_RDI,&local_10);
  check_retval(in_stack_ffffffffffffffc8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
  uVar1 = KINGetNumFuncEvals(local_8,&local_18);
  check_retval(in_stack_ffffffffffffffc8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
  uVar1 = KINGetNumJacEvals(local_8,&local_20);
  check_retval(in_stack_ffffffffffffffc8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
  uVar1 = KINGetNumLinFuncEvals(local_8,&local_28);
  check_retval(in_stack_ffffffffffffffc8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
  uVar1 = KINGetLinWorkSpace(local_8,&local_30,&stack0xffffffffffffffc8);
  check_retval(in_stack_ffffffffffffffc8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
  printf("\nFinal Statistics.. \n\n");
  printf("nni      = %6ld    nfe     = %6ld \n",local_10,local_18);
  printf("nje      = %6ld    nfeB    = %6ld \n",local_20,local_28);
  printf("\n");
  printf("lenrwB   = %6ld    leniwB  = %6ld \n",local_30,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static void PrintFinalStats(void* kmem)
{
  long int nni, nfe, nje, nfeD;
  long int lenrwB, leniwB;
  int retval;

  /* Main solver statistics */

  retval = KINGetNumNonlinSolvIters(kmem, &nni);
  check_retval(&retval, "KINGetNumNonlinSolvIters", 1);
  retval = KINGetNumFuncEvals(kmem, &nfe);
  check_retval(&retval, "KINGetNumFuncEvals", 1);

  /* Band linear solver statistics */

  retval = KINGetNumJacEvals(kmem, &nje);
  check_retval(&retval, "KINGetNumJacEvals", 1);
  retval = KINGetNumLinFuncEvals(kmem, &nfeD);
  check_retval(&retval, "KINGetNumLinFuncEvals", 1);

  /* Band linear solver workspace size */

  retval = KINGetLinWorkSpace(kmem, &lenrwB, &leniwB);
  check_retval(&retval, "KINGetLinWorkSpace", 1);

  printf("\nFinal Statistics.. \n\n");
  printf("nni      = %6ld    nfe     = %6ld \n", nni, nfe);
  printf("nje      = %6ld    nfeB    = %6ld \n", nje, nfeD);
  printf("\n");
  printf("lenrwB   = %6ld    leniwB  = %6ld \n", lenrwB, leniwB);
}